

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  int iVar11;
  bool bVar12;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar13 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar14 [16];
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  __m128i l16;
  __m128i top0;
  __m128i tl16;
  __m128i top1;
  
  auVar14 = *(undefined1 (*) [16])left;
  auVar13 = *(undefined1 (*) [16])above;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar13._0_13_;
  auVar1[0xe] = auVar13[7];
  auVar2[0xc] = auVar13[6];
  auVar2._0_12_ = auVar13._0_12_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3[0xb] = 0;
  auVar3._0_11_ = auVar13._0_11_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4[10] = auVar13[5];
  auVar4._0_10_ = auVar13._0_10_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5[9] = 0;
  auVar5._0_9_ = auVar13._0_9_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = auVar13[4];
  auVar6._0_8_ = auVar13._0_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar6._8_7_;
  auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar9[0] = auVar13[3];
  auVar9._9_6_ = 0;
  auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
  auVar10[0] = auVar13[2];
  auVar10._11_4_ = 0;
  auVar7[2] = auVar13[1];
  auVar7._0_2_ = auVar13._0_2_;
  auVar7._3_12_ = SUB1512(auVar10 << 0x20,3);
  top0[0]._0_2_ = auVar13._0_2_ & 0xff;
  top0._2_13_ = auVar7._2_13_;
  top0[1]._7_1_ = 0;
  top1[0] = (ulong)CONCAT16(auVar13[0xb],
                            (uint6)CONCAT14(auVar13[10],
                                            (uint)CONCAT12(auVar13[9],(ushort)auVar13[8])));
  top1[1]._0_1_ = auVar13[0xc];
  top1[1]._1_1_ = 0;
  top1[1]._2_1_ = auVar13[0xd];
  top1[1]._3_1_ = 0;
  top1[1]._4_1_ = auVar13[0xe];
  top1[1]._5_1_ = 0;
  top1[1]._6_1_ = auVar13[0xf];
  top1[1]._7_1_ = 0;
  auVar13 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar13._0_4_;
  iVar11 = 0x10;
  auVar13 = _DAT_0042e4a0;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    l16 = (__m128i)pshufb(auVar14,auVar13);
    paeth_16x1_pred(&l16,&top0,&top1,&tl16);
    local_98 = auVar13._0_2_;
    sStack_96 = auVar13._2_2_;
    sStack_94 = auVar13._4_2_;
    sStack_92 = auVar13._6_2_;
    sStack_90 = auVar13._8_2_;
    sStack_8e = auVar13._10_2_;
    sStack_8c = auVar13._12_2_;
    sStack_8a = auVar13._14_2_;
    *(undefined8 *)dst = extraout_XMM0_Qa;
    *(undefined8 *)(dst + 8) = extraout_XMM0_Qb;
    dst = dst + stride;
    auVar13._0_2_ = local_98 + 1;
    auVar13._2_2_ = sStack_96 + 1;
    auVar13._4_2_ = sStack_94 + 1;
    auVar13._6_2_ = sStack_92 + 1;
    auVar13._8_2_ = sStack_90 + 1;
    auVar13._10_2_ = sStack_8e + 1;
    auVar13._12_2_ = sStack_8c + 1;
    auVar13._14_2_ = sStack_8a + 1;
  }
  auVar13 = *(undefined1 (*) [16])(left + 0x10);
  iVar11 = 0x10;
  auVar14 = _DAT_0042e4a0;
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    l16 = (__m128i)pshufb(auVar13,auVar14);
    paeth_16x1_pred(&l16,&top0,&top1,&tl16);
    local_98 = auVar14._0_2_;
    sStack_96 = auVar14._2_2_;
    sStack_94 = auVar14._4_2_;
    sStack_92 = auVar14._6_2_;
    sStack_90 = auVar14._8_2_;
    sStack_8e = auVar14._10_2_;
    sStack_8c = auVar14._12_2_;
    sStack_8a = auVar14._14_2_;
    *(undefined8 *)dst = extraout_XMM0_Qa_00;
    *(undefined8 *)(dst + 8) = extraout_XMM0_Qb_00;
    dst = dst + stride;
    auVar14._0_2_ = local_98 + 1;
    auVar14._2_2_ = sStack_96 + 1;
    auVar14._4_2_ = sStack_94 + 1;
    auVar14._6_2_ = sStack_92 + 1;
    auVar14._8_2_ = sStack_90 + 1;
    auVar14._10_2_ = sStack_8e + 1;
    auVar14._12_2_ = sStack_8c + 1;
    auVar14._14_2_ = sStack_8a + 1;
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  l = _mm_load_si128((const __m128i *)(left + 16));
  rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}